

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::EnsureDirectoryExists(cmNinjaTargetGenerator *this,string *path)

{
  bool bVar1;
  char *pcVar2;
  cmake *this_00;
  allocator local_41;
  undefined1 local_40 [8];
  string fullPath;
  cmGlobalNinjaGenerator *gg;
  string *path_local;
  cmNinjaTargetGenerator *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar2);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar2);
  }
  else {
    fullPath.field_2._8_8_ = GetGlobalGenerator(this);
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)fullPath.field_2._8_8_);
    pcVar2 = cmake::GetHomeOutputDirectory(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_40,pcVar2,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix
              ((cmGlobalNinjaGenerator *)fullPath.field_2._8_8_,(string *)local_40);
    std::__cxx11::string::operator+=((string *)local_40,(string *)path);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar2);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::EnsureDirectoryExists(
  const std::string& path) const
{
  if (cmSystemTools::FileIsFullPath(path.c_str())) {
    cmSystemTools::MakeDirectory(path.c_str());
  } else {
    cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
    std::string fullPath =
      std::string(gg->GetCMakeInstance()->GetHomeOutputDirectory());
    // Also ensures their is a trailing slash.
    gg->StripNinjaOutputPathPrefixAsSuffix(fullPath);
    fullPath += path;
    cmSystemTools::MakeDirectory(fullPath.c_str());
  }
}